

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::AttachRequest>::copyConstruct
          (BasicTypeInfo<dap::AttachRequest> *this,void *dst,void *src)

{
  void *src_local;
  void *dst_local;
  BasicTypeInfo<dap::AttachRequest> *this_local;
  
  AttachRequest::AttachRequest((AttachRequest *)dst,(AttachRequest *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }